

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isxdigit.c
# Opt level: O2

int main(void)

{
  int iVar1;
  
  iVar1 = isxdigit(0x61);
  if (iVar1 == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
           ,0x1f,"isxdigit( \'a\' )");
  }
  iVar1 = isxdigit(0x66);
  if (iVar1 == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
           ,0x20,"isxdigit( \'f\' )");
  }
  iVar1 = isxdigit(0x67);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
           ,0x21,"! isxdigit( \'g\' )");
  }
  iVar1 = isxdigit(0x41);
  if (iVar1 == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
           ,0x22,"isxdigit( \'A\' )");
  }
  iVar1 = isxdigit(0x46);
  if (iVar1 == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
           ,0x23,"isxdigit( \'F\' )");
  }
  iVar1 = isxdigit(0x47);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
           ,0x24,"! isxdigit( \'G\' )");
  }
  iVar1 = isxdigit(0x40);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
           ,0x25,"! isxdigit( \'@\' )");
  }
  iVar1 = isxdigit(0x20);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
           ,0x26,"! isxdigit( \' \' )");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    TESTCASE( isxdigit( '0' ) );
    TESTCASE( isxdigit( '9' ) );
    TESTCASE( isxdigit( 'a' ) );
    TESTCASE( isxdigit( 'f' ) );
    TESTCASE( ! isxdigit( 'g' ) );
    TESTCASE( isxdigit( 'A' ) );
    TESTCASE( isxdigit( 'F' ) );
    TESTCASE( ! isxdigit( 'G' ) );
    TESTCASE( ! isxdigit( '@' ) );
    TESTCASE( ! isxdigit( ' ' ) );
    return TEST_RESULTS;
}